

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzgnames.cpp
# Opt level: O1

MatchInfoCollection * __thiscall
icu_63::TZGNCore::findTimeZoneNames
          (TZGNCore *this,UnicodeString *text,int32_t start,uint32_t types,UErrorCode *status)

{
  int iVar1;
  undefined4 extraout_var;
  
  if (types != 0) {
    iVar1 = (*(this->fTimeZoneNames->super_UObject)._vptr_UObject[0xf])();
    return (MatchInfoCollection *)CONCAT44(extraout_var,iVar1);
  }
  return (MatchInfoCollection *)0x0;
}

Assistant:

TimeZoneNames::MatchInfoCollection*
TZGNCore::findTimeZoneNames(const UnicodeString& text, int32_t start, uint32_t types, UErrorCode& status) const {
    // Check if the target name typs is really in the TimeZoneNames
    uint32_t nameTypes = 0;
    if (types & UTZGNM_LONG) {
        nameTypes |= (UTZNM_LONG_GENERIC | UTZNM_LONG_STANDARD);
    }
    if (types & UTZGNM_SHORT) {
        nameTypes |= (UTZNM_SHORT_GENERIC | UTZNM_SHORT_STANDARD);
    }

    if (types) {
        // Find matches in the TimeZoneNames
        return fTimeZoneNames->find(text, start, nameTypes, status);
    }

    return NULL;
}